

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RegexMatcher::group
          (UnicodeString *__return_storage_ptr__,RegexMatcher *this,int32_t groupNum,
          UErrorCode *status)

{
  int32_t iVar1;
  int64_t start;
  int64_t limit;
  char16_t *dest;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00251160;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  start = start64(this,groupNum,status);
  limit = end64(this,groupNum,status);
  if (((start != limit) && (start != -1)) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    iVar1 = utext_extract_63(this->fInputText,start,limit,(UChar *)0x0,0,status);
    if (*status == U_BUFFER_OVERFLOW_ERROR) {
      *status = U_ZERO_ERROR;
      dest = UnicodeString::getBuffer(__return_storage_ptr__,iVar1);
      if (dest == (char16_t *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        iVar1 = utext_extract_63(this->fInputText,start,limit,dest,iVar1,status);
        UnicodeString::releaseBuffer(__return_storage_ptr__,iVar1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexMatcher::group(int32_t groupNum, UErrorCode &status) const {
    UnicodeString result;
    int64_t groupStart = start64(groupNum, status);
    int64_t groupEnd = end64(groupNum, status);
    if (U_FAILURE(status) || groupStart == -1 || groupStart == groupEnd) {
        return result;
    }

    // Get the group length using a utext_extract preflight.
    //    UText is actually pretty efficient at this when underlying encoding is UTF-16.
    int32_t length = utext_extract(fInputText, groupStart, groupEnd, NULL, 0, &status);
    if (status != U_BUFFER_OVERFLOW_ERROR) {
        return result;
    }

    status = U_ZERO_ERROR;
    UChar *buf = result.getBuffer(length);
    if (buf == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        int32_t extractLength = utext_extract(fInputText, groupStart, groupEnd, buf, length, &status);
        result.releaseBuffer(extractLength);
        U_ASSERT(length == extractLength);
    }
    return result;
}